

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cc
# Opt level: O0

string * CEscape(string *str)

{
  byte c;
  bool bVar1;
  char cVar2;
  ulong uVar3;
  byte *pbVar4;
  ulong in_RSI;
  ulong uStack_28;
  uchar ch;
  size_t i;
  string *str_local;
  string *dest;
  
  std::__cxx11::string::string((string *)str);
  for (uStack_28 = 0; uVar3 = std::__cxx11::string::size(), uStack_28 < uVar3;
      uStack_28 = uStack_28 + 1) {
    pbVar4 = (byte *)std::__cxx11::string::operator[](in_RSI);
    c = *pbVar4;
    if (c == 9) {
      std::__cxx11::string::operator+=((string *)str,"\\t");
    }
    else if (c == 10) {
      std::__cxx11::string::operator+=((string *)str,"\\n");
    }
    else if (c == 0xd) {
      std::__cxx11::string::operator+=((string *)str,"\\r");
    }
    else if (c == 0x22) {
      std::__cxx11::string::operator+=((string *)str,"\\\"");
    }
    else if (c == 0x5c) {
      std::__cxx11::string::operator+=((string *)str,"\\\\");
    }
    else {
      bVar1 = AsciiIsPrint(c);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)str,c);
      }
      else {
        std::__cxx11::string::operator+=((string *)str,"\\");
        cVar2 = ToDecimalDigit((uint)(c >> 6));
        std::__cxx11::string::operator+=((string *)str,cVar2);
        cVar2 = ToDecimalDigit((c & 0x38) >> 3);
        std::__cxx11::string::operator+=((string *)str,cVar2);
        cVar2 = ToDecimalDigit(c & 7);
        std::__cxx11::string::operator+=((string *)str,cVar2);
      }
    }
  }
  return str;
}

Assistant:

static std::string CEscape(const std::string& str) {
  std::string dest;

  for (size_t i = 0; i < str.size(); ++i) {
    unsigned char ch = str[i];
    switch (ch) {
      case '\n': dest += "\\n"; break;
      case '\r': dest += "\\r"; break;
      case '\t': dest += "\\t"; break;
      case '\"': dest += "\\\""; break;
      case '\\': dest += "\\\\"; break;
      default:
        if (AsciiIsPrint(ch)) {
          dest += ch;
        } else {
          dest += "\\";
          dest += ToDecimalDigit(ch / 64);
          dest += ToDecimalDigit((ch % 64) / 8);
          dest += ToDecimalDigit(ch % 8);
        }
        break;
    }
  }

  return dest;
}